

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Mutability mut;
  undefined1 local_100 [8];
  string local_f8;
  string local_d8;
  ImportType local_b8;
  ValueType local_6c;
  undefined1 local_68 [8];
  GlobalType global_type;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  undefined1 auStack_30 [4];
  Type type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  global_type.mut = type.enum_;
  global_type._20_4_ =
       SharedValidator::OnGlobalImport
                 (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,type,
                  mutable_);
  bVar2 = Failed((Result)global_type._20_4_);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Error);
  }
  else {
    local_6c.enum_ = type.enum_;
    mut = ToMutability(mutable_);
    GlobalType::GlobalType((GlobalType *)local_68,local_6c,mut);
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_d8,(string_view *)&field_name_local.size_);
    string_view::to_string_abi_cxx11_((string *)(local_100 + 8),(string_view *)auStack_30);
    GlobalType::Clone((GlobalType *)local_100);
    ImportType::ImportType
              (&local_b8,&local_d8,(string *)(local_100 + 8),
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_100);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_b8);
    ImportDesc::~ImportDesc((ImportDesc *)&local_b8);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 8));
    std::__cxx11::string::~string((string *)&local_d8);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_68);
    Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
    GlobalType::~GlobalType((GlobalType *)local_68);
  }
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(loc, type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}